

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Face.cpp
# Opt level: O0

bool operator<(Position *pos1,Position *pos2)

{
  Position *pos2_local;
  Position *pos1_local;
  
  if ((int)pos1->reference_corner < (int)pos2->reference_corner) {
    pos1_local._7_1_ = true;
  }
  else if (pos1->reference_corner == pos2->reference_corner) {
    if (pos1->layer < pos2->layer) {
      pos1_local._7_1_ = true;
    }
    else if (pos1->layer == pos2->layer) {
      pos1_local._7_1_ = pos1->entry < pos2->entry;
    }
    else {
      pos1_local._7_1_ = false;
    }
  }
  else {
    pos1_local._7_1_ = false;
  }
  return pos1_local._7_1_;
}

Assistant:

bool operator< (const Position &pos1, const Position &pos2)
{
    if(pos1.reference_corner < pos2.reference_corner){
        return true;
    }
    else if(pos1.reference_corner == pos2.reference_corner){
        if(pos1.layer < pos2.layer){
            return true;
        }
        else if(pos1.layer == pos2.layer){
            return pos1.entry < pos2.entry;
        }
        else{
            return false;
        }
    }
    else{
        return false;
    }
}